

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O1

SUNErrCode N_VWrmsNormMaskVectorArray(int nvec,N_Vector *X,N_Vector *W,N_Vector id,sunrealtype *nrm)

{
  _func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_N_Vector_sunrealtype_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  ulong uVar2;
  sunrealtype sVar3;
  
  UNRECOVERED_JUMPTABLE = id->ops->nvwrmsnormmaskvectorarray;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_N_Vector_sunrealtype_ptr *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,X,W,id,nrm);
    return SVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      sVar3 = (*id->ops->nvwrmsnormmask)(X[uVar2],W[uVar2],id);
      nrm[uVar2] = sVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

SUNErrCode N_VWrmsNormMaskVectorArray(int nvec, N_Vector* X, N_Vector* W,
                                      N_Vector id, sunrealtype* nrm)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (id->ops->nvwrmsnormmaskvectorarray != NULL)
  {
    ier = id->ops->nvwrmsnormmaskvectorarray(nvec, X, W, id, nrm);
  }
  else
  {
    for (i = 0; i < nvec; i++)
    {
      nrm[i] = id->ops->nvwrmsnormmask(X[i], W[i], id);
    }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}